

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateFunctionCallFinal
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,ArrayView<FunctionValue> functions
          ,IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,bool allowFailure)

{
  bool *pbVar1;
  FunctionData *function;
  Lexeme *pLVar2;
  SynIdentifier *pSVar3;
  Allocator *pAVar4;
  ModuleData *pMVar5;
  _func_int **pp_Var6;
  char *pcVar7;
  long lVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  Lexeme *pLVar17;
  InplaceStr functionName;
  InplaceStr functionName_00;
  FunctionValue proto;
  FunctionValue proto_00;
  FunctionValue proto_01;
  FunctionValue proto_02;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  ArrayView<ArgumentData> arguments_03;
  ArrayView<ArgumentData> arguments_04;
  ArrayView<ArgumentData> arguments_05;
  ArrayView<ArgumentData> arguments_06;
  ArrayView<unsigned_int> ratings_00;
  ArrayView<unsigned_int> ratings_01;
  ArgumentData *pAVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeBase *pTVar23;
  TypeFunction *pTVar24;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar25;
  ExprBase *pEVar26;
  undefined8 *puVar27;
  TypeRef *pTVar28;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  ExprBase *arg1;
  FunctionData *pFVar29;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  TypeError *pTVar30;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TypeHandle *pTVar31;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  uint uVar32;
  int iVar33;
  ExpressionContext *pEVar34;
  ArrayView<ArgumentData> *pAVar35;
  ulong uVar36;
  ulong uVar37;
  char *pcVar38;
  FunctionData **ppFVar39;
  MatchData *pMVar40;
  char *pcVar41;
  ulong uVar42;
  ExpressionContext *this;
  uint uVar43;
  ArgumentData *pAVar44;
  undefined7 in_register_00000089;
  uint k;
  long lVar45;
  bool bVar46;
  undefined4 uVar47;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> functionArguments_00;
  ArrayView<ArgumentData> functionArguments_01;
  InplaceStr name;
  ArrayView<ArgumentData> functionArguments_02;
  ArrayView<FunctionValue> functions_02;
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  IntrusiveList<TypeHandle> generics_02;
  ArrayView<ArgumentData> arguments_07;
  IntrusiveList<TypeHandle> generics_03;
  ArrayView<ArgumentData> arguments_08;
  ArrayView<CallArgumentData> arguments_09;
  ArrayView<ArgumentData> arguments_10;
  ArrayView<CallArgumentData> arguments_11;
  ArrayView<ArgumentData> arguments_12;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_13;
  FunctionValue bestOverload;
  IntrusiveList<ExprBase> actualArguments;
  IntrusiveList<MatchData> aliasesB;
  IntrusiveList<MatchData> aliasesA;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<CallArgumentData,_16U> resultB;
  IntrusiveList<ExprBase> errorArguments;
  undefined4 uVar48;
  FunctionData *local_930;
  char *local_918;
  TypeFunction *local_910;
  TypeFunction *local_908;
  ExpressionContext *local_8f8;
  FunctionValue local_8e8;
  IntrusiveList<ExprBase> local_8c8;
  ArgumentData *local_8b0;
  TypeBase *local_8a8;
  SynBase *local_8a0;
  FunctionData *pFStack_898;
  undefined8 *local_890;
  SynBase *local_888;
  FunctionData *pFStack_880;
  undefined8 *local_878;
  SynBase *local_870;
  FunctionData *pFStack_868;
  undefined8 *local_860;
  ExprBase *local_858;
  uint uStack_850;
  undefined4 uStack_84c;
  ExpressionContext *local_848;
  uint uStack_840;
  undefined4 uStack_83c;
  ExprBase *local_838;
  uint uStack_830;
  undefined4 uStack_82c;
  ExpressionContext *local_828;
  uint uStack_820;
  undefined4 uStack_81c;
  IntrusiveList<MatchData> local_818;
  IntrusiveList<MatchData> local_808;
  undefined1 local_7f8 [8];
  TypeRef *pTStack_7f0;
  ExprBase local_7e8 [2];
  Allocator *local_768;
  undefined1 local_760 [264];
  undefined8 uStack_658;
  Allocator *local_650;
  undefined1 local_648 [16];
  undefined1 local_638 [8];
  bool local_630 [8];
  TypeBase *local_628;
  TypeBase *local_620;
  TypeBase *local_618;
  FunctionData *local_610;
  SynIdentifier *local_538;
  ModuleData *local_4b8;
  Allocator *local_38;
  undefined4 extraout_var_03;
  
  pAVar44 = arguments.data;
  uVar21 = arguments.count;
  pEVar34 = (ExpressionContext *)functions.data;
  pTVar24 = (TypeFunction *)(CONCAT71(in_register_00000089,allowFailure) & 0xffffffff);
  uVar32 = functions.count;
  pAVar35 = &arguments;
  if ((value == (ExprBase *)0x0) || (value->type == (TypeBase *)0x0)) {
    bVar46 = false;
  }
  else {
    bVar46 = value->type->typeID == 0;
  }
  uVar37 = (ulong)arguments.count;
  pTVar31 = generics.head;
  pAVar18 = arguments.data;
  if (uVar37 != 0) {
    lVar45 = 0;
    do {
      pEVar26 = *(ExprBase **)((long)&pAVar44->value + lVar45);
      pTVar23 = pEVar26->type;
      if (((pTVar23 != (TypeBase *)0x0) && (pTVar23->typeID == 0)) ||
         (bVar19 = AssertResolvableTypeLiteral(ctx,source,pEVar26), !bVar19)) {
        bVar46 = true;
      }
      lVar45 = lVar45 + 0x30;
      pAVar18 = arguments.data;
    } while (uVar37 * 0x30 != lVar45);
  }
  for (; arguments.data = pAVar18, pTVar31 != (TypeHandle *)0x0; pTVar31 = pTVar31->next) {
    pTVar23 = pTVar31->type;
    if ((pTVar23 == (TypeBase *)0x0) || (pTVar23->typeID != 0)) {
      pAVar35 = (ArrayView<ArgumentData> *)0x0;
      bVar19 = AssertResolvableType(ctx,source,pTVar23,false);
      if (!bVar19) goto LAB_001e6ecb;
    }
    else {
LAB_001e6ecb:
      bVar46 = true;
    }
    pAVar18 = arguments.data;
  }
  if (bVar46) {
    local_648._0_4_ = 0;
    local_648._4_4_ = 0;
    local_648._8_4_ = 0;
    local_648._12_4_ = 0;
    uVar37 = (ulong)arguments.count;
    if (uVar37 != 0) {
      uVar36 = (ulong)arguments.count;
      lVar45 = 0;
      do {
        iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        if (uVar36 * 0x30 == lVar45) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x22a,
                        "T &ArrayView<ArgumentData>::operator[](unsigned int) [T = ArgumentData]");
        }
        pEVar26 = *(ExprBase **)((long)&pAVar18->value + lVar45);
        ExprPassthrough::ExprPassthrough
                  ((ExprPassthrough *)CONCAT44(extraout_var,iVar20),pEVar26->source,pEVar26->type,
                   pEVar26);
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)local_648,(ExprBase *)CONCAT44(extraout_var,iVar20));
        lVar45 = lVar45 + 0x30;
      } while (uVar37 * 0x30 != lVar45);
    }
    iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar26 = (ExprBase *)CONCAT44(extraout_var_00,iVar20);
    pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar26->typeID = 0x29;
    pEVar26->source = source;
    pEVar26->type = pTVar23;
    pEVar26->next = (ExprBase *)0x0;
    pEVar26->listed = false;
    pEVar26->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6a98;
    pEVar26[1]._vptr_ExprBase = (_func_int **)value;
    goto LAB_001e8670;
  }
  if (value == (ExprBase *)0x0) {
    local_910 = (TypeFunction *)0x0;
  }
  else {
    local_910 = (TypeFunction *)value->type;
    if ((local_910 == (TypeFunction *)0x0) || ((local_910->super_TypeBase).typeID != 0x15)) {
      local_910 = (TypeFunction *)0x0;
    }
  }
  local_8c8.head = (ExprBase *)0x0;
  local_8c8.tail = (ExprBase *)0x0;
  if (uVar32 == 0) {
    if (local_910 == (TypeFunction *)0x0) {
      if (value != (ExprBase *)0x0) {
        if (((uVar21 != 1) || (value->typeID != 8)) || (pAVar18->name != (SynIdentifier *)0x0)) {
          if ((value == (ExprBase *)0x0) || (pEVar26 = value, value->typeID != 8))
          goto LAB_001e7cd9;
          goto LAB_001e7cdb;
        }
        if ((value == (ExprBase *)0x0) || (pEVar26 = value, value->typeID != 8)) {
          pEVar26 = (ExprBase *)0x0;
        }
        if (pEVar26 == (ExprBase *)0x0) {
LAB_001e86bd:
          pEVar26 = CreateCast(ctx,source,pAVar18->value,(TypeBase *)value[1]._vptr_ExprBase,true);
          return pEVar26;
        }
        pp_Var6 = pEVar26[1]._vptr_ExprBase;
        if ((pp_Var6 == (_func_int **)0x0) || (*(int *)(pp_Var6 + 1) != 0x16)) {
          if (*(char *)((long)pp_Var6 + 0x3c) != '\x01') goto LAB_001e86bd;
          goto LAB_001e8b67;
        }
LAB_001e8b73:
        pcVar41 = "ERROR: generic type arguments in <> are not found after constructor name";
        goto LAB_001e8aa9;
      }
LAB_001e7cd9:
      pEVar26 = (ExprBase *)0x0;
LAB_001e7cdb:
      if (pEVar26 != (ExprBase *)0x0) {
        pp_Var6 = pEVar26[1]._vptr_ExprBase;
        if ((pp_Var6 != (_func_int **)0x0) && (*(int *)(pp_Var6 + 1) == 0x16)) goto LAB_001e8b73;
        if (*(char *)((long)pp_Var6 + 0x3c) == '\x01') {
LAB_001e8b67:
          pcVar41 = "ERROR: can\'t cast to a generic type";
          local_648._0_8_ = (SynBase *)CONCAT44(local_648._4_4_,local_648._0_4_);
          local_8e8.source = (SynBase *)CONCAT44(local_8e8.source._4_4_,local_8e8.source._0_4_);
          goto LAB_001e8aa9;
        }
      }
      auVar15._8_8_ = 0;
      auVar15._0_8_ = pAVar35;
      name_00.end = "";
      name_00.begin = "()";
      pEVar26 = CreateVariableAccess
                          (ctx,source,(IntrusiveList<SynIdentifier>)(auVar15 << 0x40),name_00,false)
      ;
      pAVar44 = arguments.data;
      if (pEVar26 == (ExprBase *)0x0) {
        bVar46 = false;
        anon_unknown.dwarf_11255e::Report
                  (ctx,source,
                   "ERROR: operator \'()\' accepting %d argument(s) is undefined for a class \'%.*s\'"
                   ,uVar37,(ulong)(uint)(*(int *)&(value->type->name).end -
                                        (int)(value->type->name).begin));
        iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pEVar26 = (ExprBase *)CONCAT44(extraout_var_08,iVar20);
        pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar26->typeID = 0x29;
        pEVar26->source = source;
        pEVar26->type = pTVar23;
        pEVar26->next = (ExprBase *)0x0;
        pEVar26->listed = false;
        pEVar26->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6a98;
        pEVar26[1]._vptr_ExprBase = (_func_int **)value;
        *(ExprBase **)&pEVar26[1].typeID = local_8c8.head;
        pEVar26[1].source = (SynBase *)local_8c8.tail;
      }
      else {
        pAVar4 = ctx->allocator;
        lVar45 = 0x20;
        do {
          *(undefined8 *)((long)&uStack_658 + lVar45) = 0;
          *(undefined1 *)((long)&local_650 + lVar45) = 0;
          *(undefined8 *)(local_648 + lVar45) = 0;
          *(undefined8 *)(local_648 + lVar45 + 8) = 0;
          pbVar1 = local_630 + lVar45 + -8;
          pbVar1[0] = false;
          pbVar1[1] = false;
          pbVar1[2] = false;
          pbVar1[3] = false;
          pbVar1[4] = false;
          pbVar1[5] = false;
          pbVar1[6] = false;
          pbVar1[7] = false;
          pbVar1 = local_630 + lVar45;
          pbVar1[0] = false;
          pbVar1[1] = false;
          pbVar1[2] = false;
          pbVar1[3] = false;
          pbVar1[4] = false;
          pbVar1[5] = false;
          pbVar1[6] = false;
          pbVar1[7] = false;
          lVar45 = lVar45 + 0x30;
        } while (lVar45 != 0x620);
        local_648._0_8_ = local_648 + 0x10;
        local_648._12_4_ = 0x20;
        local_638 = (undefined1  [8])value->source;
        local_620 = value->type;
        local_648._8_4_ = 1;
        local_630[0] = false;
        local_628 = (TypeBase *)0x0;
        local_610 = (FunctionData *)0x0;
        local_618 = (TypeBase *)value;
        local_38 = pAVar4;
        if (uVar37 != 0) {
          lVar45 = 0;
          do {
            if (local_648._8_4_ == local_648._12_4_) {
              SmallArray<ArgumentData,_32U>::grow
                        ((SmallArray<ArgumentData,_32U> *)local_648,local_648._8_4_);
            }
            if ((SynBase *)local_648._0_8_ == (SynBase *)0x0) {
              pcVar41 = 
              "void SmallArray<ArgumentData, 32>::push_back(const T &) [T = ArgumentData, N = 32]";
              goto LAB_001e8a79;
            }
            puVar27 = (undefined8 *)((long)&pAVar44->source + lVar45);
            uVar36 = (ulong)(uint)local_648._8_4_;
            local_648._8_4_ = local_648._8_4_ + 1;
            pp_Var6 = (_func_int **)*puVar27;
            uVar16 = puVar27[1];
            pLVar2 = (Lexeme *)puVar27[2];
            pLVar17 = (Lexeme *)puVar27[3];
            pcVar41 = (char *)puVar27[5];
            (&((SynBase *)local_648._0_8_)->pos)[uVar36 * 3].begin = (char *)puVar27[4];
            (&((SynBase *)local_648._0_8_)->pos)[uVar36 * 3].end = pcVar41;
            (&((SynBase *)local_648._0_8_)->begin)[uVar36 * 6] = pLVar2;
            (&((SynBase *)local_648._0_8_)->begin + uVar36 * 6)[1] = pLVar17;
            (&((SynBase *)local_648._0_8_)->_vptr_SynBase)[uVar36 * 6] = pp_Var6;
            (&((SynBase *)local_648._0_8_)->_vptr_SynBase + uVar36 * 6)[1] = (_func_int **)uVar16;
            lVar45 = lVar45 + 0x30;
          } while (uVar37 * 0x30 != lVar45);
        }
        arguments_07.count = local_648._8_4_;
        arguments_07.data = (ArgumentData *)local_648._0_8_;
        arguments_07._12_4_ = 0;
        pEVar26 = CreateFunctionCall(ctx,source,pEVar26,arguments_07,false);
        bVar46 = pEVar26 == (ExprBase *)0x0;
        SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_648);
      }
      if (!bVar46) {
        return pEVar26;
      }
      local_910 = (TypeFunction *)0x0;
      goto LAB_001e858a;
    }
    if (local_910->returnType != ctx->typeAuto) {
      pMVar5 = (ModuleData *)ctx->allocator;
      lVar45 = 0x20;
      do {
        *(undefined8 *)((long)&uStack_658 + lVar45) = 0;
        *(undefined1 *)((long)&local_650 + lVar45) = 0;
        *(undefined8 *)(local_648 + lVar45) = 0;
        *(undefined8 *)(local_648 + lVar45 + 8) = 0;
        pbVar1 = local_630 + lVar45 + -8;
        pbVar1[0] = false;
        pbVar1[1] = false;
        pbVar1[2] = false;
        pbVar1[3] = false;
        pbVar1[4] = false;
        pbVar1[5] = false;
        pbVar1[6] = false;
        pbVar1[7] = false;
        pbVar1 = local_630 + lVar45;
        pbVar1[0] = false;
        pbVar1[1] = false;
        pbVar1[2] = false;
        pbVar1[3] = false;
        pbVar1[4] = false;
        pbVar1[5] = false;
        pbVar1[6] = false;
        pbVar1[7] = false;
        lVar45 = lVar45 + 0x30;
      } while (lVar45 != 0x1a0);
      local_648._0_8_ = local_648 + 0x10;
      local_648._8_4_ = 0;
      local_648._12_4_ = 8;
      pTVar31 = (local_910->arguments).head;
      local_4b8 = pMVar5;
      if (pTVar31 != (TypeHandle *)0x0) {
        do {
          pTVar23 = pTVar31->type;
          if (local_648._8_4_ == local_648._12_4_) {
            SmallArray<ArgumentData,_8U>::grow
                      ((SmallArray<ArgumentData,_8U> *)local_648,local_648._8_4_);
          }
          if ((SynBase *)local_648._0_8_ == (SynBase *)0x0) {
            pcVar41 = 
            "void SmallArray<ArgumentData, 8>::push_back(const T &) [T = ArgumentData, N = 8]";
LAB_001e8a79:
            local_648._0_8_ = (SynBase *)0x0;
            __assert_fail("data",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x162,pcVar41);
          }
          uVar37 = (ulong)(uint)local_648._8_4_;
          local_648._8_4_ = local_648._8_4_ + 1;
          (&((SynBase *)local_648._0_8_)->_vptr_SynBase)[uVar37 * 6] = (_func_int **)0x0;
          *(undefined1 *)(&((SynBase *)local_648._0_8_)->typeID + uVar37 * 0xc) = 0;
          (&((SynBase *)local_648._0_8_)->begin)[uVar37 * 6] = (Lexeme *)0x0;
          (&((SynBase *)local_648._0_8_)->end)[uVar37 * 6] = (Lexeme *)pTVar23;
          (&((SynBase *)local_648._0_8_)->pos)[uVar37 * 3].begin = (char *)0x0;
          (&((SynBase *)local_648._0_8_)->pos)[uVar37 * 3].end = (char *)0x0;
          pTVar31 = pTVar31->next;
        } while (pTVar31 != (TypeHandle *)0x0);
      }
      pAVar4 = ctx->allocator;
      memset((ArgumentData *)(local_760 + 0x10),0,0x100);
      local_760._8_4_ = 0;
      local_760._12_4_ = 0x10;
      functionArguments_01.count = local_648._8_4_;
      functionArguments_01.data = (ArgumentData *)local_648._0_8_;
      functionArguments_01._12_4_ = 0;
      arguments_12.count = uVar21;
      arguments_12.data = arguments.data;
      arguments_12._12_4_ = 0;
      local_760._0_8_ = (ArgumentData *)(local_760 + 0x10);
      local_650 = pAVar4;
      bVar46 = PrepareArgumentsForFunctionCall
                         (ctx,source,functionArguments_01,arguments_12,
                          (SmallArray<CallArgumentData,_16U> *)local_760,(uint *)0x0,true);
      if (bVar46) {
        if (local_760._8_4_ != 0) {
          lVar45 = 8;
          uVar37 = 0;
          do {
            IntrusiveList<ExprBase>::push_back
                      (&local_8c8,*(ExprBase **)((long)(TypeBase **)local_760._0_8_ + lVar45));
            uVar37 = uVar37 + 1;
            lVar45 = lVar45 + 0x10;
          } while (uVar37 < (uint)local_760._8_4_);
        }
      }
      else if ((char)pTVar24 == '\0') {
        pcVar41 = ctx->errorBuf;
        if ((pcVar41 != (char *)0x0) && (ctx->errorBufSize != 0)) {
          if (ctx->errorCount == 0) {
            ctx->errorPos = (source->pos).begin;
            ctx->errorBufLocation = pcVar41;
          }
          pcVar7 = ctx->errorBufLocation;
          iVar20 = (int)pcVar7;
          uVar32 = ctx->errorBufSize + ((int)pcVar41 - iVar20);
          if (uVar21 == local_648._8_4_) {
            iVar33 = NULLC::SafeSprintf(pcVar7,(ulong)uVar32,
                                        "ERROR: there is no conversion from specified arguments and the ones that function accepts\n"
                                       );
          }
          else {
            iVar33 = NULLC::SafeSprintf(pcVar7,(ulong)uVar32,
                                        "ERROR: function expects %d argument(s), while %d are supplied\n"
                                       );
          }
          iVar22 = NULLC::SafeSprintf(pcVar7 + iVar33,(ulong)(uVar32 - iVar33),"\tExpected: (");
          pcVar41 = pcVar7 + iVar33 + iVar22;
          if (local_648._8_4_ != 0) {
            lVar45 = 0;
            uVar37 = 0;
            do {
              pcVar38 = ", ";
              if (lVar45 == 0) {
                pcVar38 = "";
              }
              lVar8 = *(long *)((long)&((SynBase *)local_648._0_8_)->end + lVar45);
              iVar33 = NULLC::SafeSprintf(pcVar41,(ulong)((iVar20 - (int)pcVar41) + uVar32),"%s%.*s"
                                          ,pcVar38,(ulong)(uint)(*(int *)(lVar8 + 0x18) -
                                                                (int)*(undefined8 *)(lVar8 + 0x10)))
              ;
              pcVar41 = pcVar41 + iVar33;
              uVar37 = uVar37 + 1;
              lVar45 = lVar45 + 0x30;
            } while (uVar37 < (uint)local_648._8_4_);
          }
          iVar33 = NULLC::SafeSprintf(pcVar41,(ulong)((iVar20 - (int)pcVar41) + uVar32),")\n");
          pcVar41 = pcVar41 + iVar33;
          iVar33 = NULLC::SafeSprintf(pcVar41,(ulong)((iVar20 - (int)pcVar41) + uVar32),
                                      "\tProvided: (");
          pcVar41 = pcVar41 + iVar33;
          if (arguments.count != 0) {
            lVar45 = 0;
            uVar37 = 0;
            do {
              pcVar38 = ", ";
              if (lVar45 == 0) {
                pcVar38 = "";
              }
              lVar8 = *(long *)((long)&(arguments.data)->type + lVar45);
              iVar33 = NULLC::SafeSprintf(pcVar41,(ulong)((iVar20 - (int)pcVar41) + uVar32),"%s%.*s"
                                          ,pcVar38,(ulong)(uint)(*(int *)(lVar8 + 0x18) -
                                                                (int)*(undefined8 *)(lVar8 + 0x10)))
              ;
              pcVar41 = pcVar41 + iVar33;
              uVar37 = uVar37 + 1;
              lVar45 = lVar45 + 0x30;
            } while (uVar37 < arguments.count);
          }
          NULLC::SafeSprintf(pcVar41,(ulong)((iVar20 - (int)pcVar41) + uVar32),")");
          pcVar41 = ctx->errorBufLocation;
          sVar25 = strlen(pcVar41);
          pcVar41 = pcVar41 + sVar25;
          ctx->errorBufLocation = pcVar41;
          anon_unknown.dwarf_11255e::AddErrorInfoWithLocation
                    (ctx,&ctx->errorInfo,source,pcVar7,pcVar41);
        }
        pAVar44 = arguments.data;
        if (ctx->errorHandlerNested == true) {
          if (ctx->errorHandlerActive == false) {
            __assert_fail("ctx.errorHandlerActive",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1e4e,
                          "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          goto LAB_001e8b8a;
        }
        ctx->errorCount = ctx->errorCount + 1;
        local_7f8 = (undefined1  [8])0x0;
        pTStack_7f0 = (TypeRef *)0x0;
        uVar37 = (ulong)arguments.count;
        if (uVar37 != 0) {
          lVar45 = 0;
          do {
            iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar26 = *(ExprBase **)((long)&pAVar44->value + lVar45);
            ExprPassthrough::ExprPassthrough
                      ((ExprPassthrough *)CONCAT44(extraout_var_14,iVar20),pEVar26->source,
                       pEVar26->type,pEVar26);
            IntrusiveList<ExprBase>::push_back
                      ((IntrusiveList<ExprBase> *)local_7f8,
                       (ExprBase *)CONCAT44(extraout_var_14,iVar20));
            lVar45 = lVar45 + 0x30;
          } while (uVar37 * 0x30 != lVar45);
        }
        iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        pTVar24 = (TypeFunction *)CONCAT44(extraout_var_15,iVar20);
        pTVar30 = ExpressionContext::GetErrorType(ctx);
        (pTVar24->super_TypeBase).typeID = 0x29;
        (pTVar24->super_TypeBase).name.begin = (char *)source;
        (pTVar24->super_TypeBase).name.end = (char *)pTVar30;
        (pTVar24->super_TypeBase).importModule = (ModuleData *)0x0;
        *(undefined1 *)&(pTVar24->super_TypeBase).typeIndex = 0;
        (pTVar24->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__ExprBase_003f6a98;
        (pTVar24->super_TypeBase).size = (longlong)value;
        (pTVar24->super_TypeBase).padding = local_7f8._0_4_;
        (pTVar24->super_TypeBase).isGeneric = (bool)local_7f8[4];
        (pTVar24->super_TypeBase).hasPointers = (bool)local_7f8[5];
        (pTVar24->super_TypeBase).hasTranslation = (bool)local_7f8[6];
        (pTVar24->super_TypeBase).field_0x3f = local_7f8[7];
        (pTVar24->super_TypeBase).refType = pTStack_7f0;
      }
      else {
        pTVar24 = (TypeFunction *)0x0;
      }
      SmallArray<CallArgumentData,_16U>::~SmallArray((SmallArray<CallArgumentData,_16U> *)local_760)
      ;
      SmallArray<ArgumentData,_8U>::~SmallArray((SmallArray<ArgumentData,_8U> *)local_648);
      goto joined_r0x001e8584;
    }
    anon_unknown.dwarf_11255e::Report(ctx,source,"ERROR: function type is unresolved at this point")
    ;
    iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar26 = (ExprBase *)CONCAT44(extraout_var_07,iVar20);
    pTVar23 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  }
  else {
    local_768 = ctx->allocator;
    local_7f8 = (undefined1  [8])local_7e8;
    pTStack_7f0 = (TypeRef *)0x2000000000;
    arguments_00._12_4_ = arguments._12_4_;
    arguments_00.count = arguments.count;
    arguments_00.data = pAVar18;
    functions_02._12_4_ = 0;
    functions_02.data = (FunctionValue *)SUB128(functions._0_12_,0);
    functions_02.count = SUB124(functions._0_12_,8);
    SelectBestFunction(&local_8e8,ctx,source,functions_02,generics,arguments_00,
                       (SmallArray<unsigned_int,_32U> *)local_7f8);
    pFVar29 = local_8e8.function;
    local_930 = local_8e8.function;
    if (local_8e8.function != (FunctionData *)0x0) {
      uVar36 = (ulong)uVar32;
      ppFVar39 = (FunctionData **)&pEVar34->code;
      pAVar44 = (ArgumentData *)0xffffffff;
      uVar42 = 0;
      do {
        if (*ppFVar39 == local_8e8.function) {
          if (((ulong)pTStack_7f0 & 0xffffffff) <= uVar42) goto LAB_001e8a0f;
          pAVar44 = (ArgumentData *)(ulong)*(uint *)((long)(_func_int ***)local_7f8 + uVar42 * 4);
        }
        uVar42 = uVar42 + 1;
        ppFVar39 = ppFVar39 + 3;
      } while (uVar36 != uVar42);
      uVar43 = (uint)pAVar44;
      local_8a8 = (TypeBase *)local_8e8.context;
      local_8b0 = arguments.data;
      ppFVar39 = (FunctionData **)&pEVar34->code;
      bVar46 = true;
      uVar42 = 0;
      this = pEVar34;
LAB_001e711d:
      function = *ppFVar39;
      if (function == pFVar29) goto LAB_001e7392;
      if (((ulong)pTStack_7f0 & 0xffffffff) <= uVar42) {
LAB_001e8a0f:
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<unsigned int, 32>::operator[](unsigned int) [T = unsigned int, N = 32]"
                     );
      }
      if (*(uint *)((long)(_func_int ***)local_7f8 + uVar42 * 4) != uVar43) goto LAB_001e7392;
      pLVar2 = (Lexeme *)(local_8a8->name).end;
      if ((pLVar2 != (Lexeme *)0x0) && (*(int *)&pLVar2->pos == 0x10)) {
        bVar19 = ExpressionContext::IsGenericFunction(this,function);
        if (bVar19) {
          bVar19 = ExpressionContext::IsGenericFunction(this,pFVar29);
          if (bVar19) {
            local_808.head = (MatchData *)0x0;
            local_808.tail = (MatchData *)0x0;
            pSVar3 = (SynIdentifier *)ctx->allocator;
            memset(local_648 + 0x10,0,0x100);
            local_648._0_8_ = local_648 + 0x10;
            local_648._8_4_ = 0;
            local_648._12_4_ = 0x10;
            uVar9 = (function->arguments).data;
            uVar10 = (function->arguments).count;
            functionArguments.count = uVar10;
            functionArguments.data = (ArgumentData *)uVar9;
            functionArguments._12_4_ = 0;
            arguments_08.count = uVar21;
            arguments_08.data = local_8b0;
            arguments_08._12_4_ = 0;
            local_538 = pSVar3;
            bVar19 = PrepareArgumentsForFunctionCall
                               (ctx,source,functionArguments,arguments_08,
                                (SmallArray<CallArgumentData,_16U> *)local_648,(uint *)0x0,false);
            if (bVar19) {
              arguments_09.count = local_648._8_4_;
              arguments_09.data = (CallArgumentData *)local_648._0_8_;
              arguments_09._12_4_ = 0;
              local_908 = GetGenericFunctionInstanceType
                                    (ctx,source,(*ppFVar39)->scope->ownerType,*ppFVar39,arguments_09
                                     ,&local_808);
            }
            else {
              local_908 = (TypeFunction *)0x0;
            }
            local_818.head = (MatchData *)0x0;
            local_818.tail = (MatchData *)0x0;
            pAVar4 = ctx->allocator;
            memset((ArgumentData *)(local_760 + 0x10),0,0x100);
            local_760._8_4_ = 0;
            local_760._12_4_ = 0x10;
            uVar11 = (pFVar29->arguments).data;
            uVar12 = (pFVar29->arguments).count;
            functionArguments_00.count = uVar12;
            functionArguments_00.data = (ArgumentData *)uVar11;
            functionArguments_00._12_4_ = 0;
            arguments_10.count = uVar21;
            arguments_10.data = local_8b0;
            arguments_10._12_4_ = 0;
            pAVar44 = local_8b0;
            local_760._0_8_ = (ArgumentData *)(local_760 + 0x10);
            local_650 = pAVar4;
            bVar19 = PrepareArgumentsForFunctionCall
                               (ctx,source,functionArguments_00,arguments_10,
                                (SmallArray<CallArgumentData,_16U> *)local_760,(uint *)0x0,false);
            if (bVar19) {
              arguments_11.count = local_760._8_4_;
              arguments_11.data = (CallArgumentData *)local_760._0_8_;
              arguments_11._12_4_ = 0;
              pAVar44 = (ArgumentData *)local_760._0_8_;
              pTVar24 = GetGenericFunctionInstanceType
                                  (ctx,source,pFVar29->scope->ownerType,pFVar29,arguments_11,
                                   &local_818);
            }
            else {
              pTVar24 = (TypeFunction *)0x0;
            }
            SmallArray<CallArgumentData,_16U>::~SmallArray
                      ((SmallArray<CallArgumentData,_16U> *)local_760);
            this = (ExpressionContext *)local_648;
            SmallArray<CallArgumentData,_16U>::~SmallArray
                      ((SmallArray<CallArgumentData,_16U> *)this);
            if (((local_908 == pTVar24) && (local_908 != (TypeFunction *)0x0)) &&
               (pTVar24 != (TypeFunction *)0x0)) goto LAB_001e7392;
          }
        }
      }
      pcVar41 = ctx->errorBuf;
      if ((pcVar41 != (char *)0x0) && (ctx->errorBufSize != 0)) {
        if (ctx->errorCount == 0) {
          ctx->errorPos = (source->pos).begin;
          ctx->errorBufLocation = pcVar41;
        }
        pAVar44 = (ArgumentData *)ctx->errorBufLocation;
        NULLC::SafeSprintf((char *)pAVar44,
                           (ulong)(ctx->errorBufSize + ((int)pcVar41 - (int)pAVar44)),
                           "ERROR: ambiguity, there is more than one overloaded function available for the call:\n"
                          );
        pcVar41 = ctx->errorBufLocation;
        sVar25 = strlen(pcVar41);
        pcVar41 = pcVar41 + sVar25;
        ctx->errorBufLocation = pcVar41;
        pSVar3 = ((FunctionData *)pEVar34->code)->name;
        local_858 = (ExprBase *)local_7f8;
        uStack_850 = (uint)pTStack_7f0;
        ratings_00._12_4_ = uStack_84c;
        ratings_00.count = (uint)pTStack_7f0;
        arguments_05._12_4_ = arguments._12_4_;
        arguments_05.count = arguments.count;
        functions_00._12_4_ = uStack_83c;
        functions_00.count = uVar32;
        functionName.end._4_4_ = (int)((ulong)(pSVar3->name).end >> 0x20);
        functionName._0_12_ = *(undefined1 (*) [12])&pSVar3->name;
        functions_00.data = (FunctionValue *)pEVar34;
        arguments_05.data = arguments.data;
        ratings_00.data = (uint *)local_7f8;
        local_848 = pEVar34;
        uStack_840 = uVar32;
        ReportOnFunctionSelectError
                  (ctx,source,pcVar41,(*(int *)&ctx->errorBuf - (int)pcVar41) + ctx->errorBufSize,
                   (char *)pAVar44,functionName,functions_00,generics,arguments_05,ratings_00,uVar43
                   ,true);
        pcVar41 = ctx->errorBufLocation;
        sVar25 = strlen(pcVar41);
        ctx->errorBufLocation = pcVar41 + sVar25;
      }
      pAVar18 = arguments.data;
      if (ctx->errorHandlerNested == true) {
        if (ctx->errorHandlerActive == false) {
          __assert_fail("ctx.errorHandlerActive",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x1d90,
                        "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                       );
        }
        goto LAB_001e8b8a;
      }
      ctx->errorCount = ctx->errorCount + 1;
      local_648._0_4_ = 0;
      local_648._4_4_ = 0;
      local_648._8_4_ = 0;
      local_648._12_4_ = 0;
      if (uVar37 != 0) {
        lVar45 = 0;
        do {
          iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar26 = *(ExprBase **)((long)&pAVar18->value + lVar45);
          ExprPassthrough::ExprPassthrough
                    ((ExprPassthrough *)CONCAT44(extraout_var_01,iVar20),pEVar26->source,
                     pEVar26->type,pEVar26);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)local_648,
                     (ExprBase *)CONCAT44(extraout_var_01,iVar20));
          lVar45 = lVar45 + 0x30;
        } while (uVar37 * 0x30 != lVar45);
      }
      iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      local_908 = (TypeFunction *)CONCAT44(extraout_var_02,iVar20);
      this = ctx;
      pTVar30 = ExpressionContext::GetErrorType(ctx);
      (local_908->super_TypeBase).typeID = 0x29;
      (local_908->super_TypeBase).name.begin = (char *)source;
      (local_908->super_TypeBase).name.end = (char *)pTVar30;
      (local_908->super_TypeBase).importModule = (ModuleData *)0x0;
      *(undefined1 *)&(local_908->super_TypeBase).typeIndex = 0;
      (local_908->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__ExprBase_003f6a98;
      (local_908->super_TypeBase).size = (longlong)value;
      *(undefined8 *)&(local_908->super_TypeBase).padding = local_648._0_8_;
      (local_908->super_TypeBase).refType = (TypeRef *)CONCAT44(local_648._12_4_,local_648._8_4_);
LAB_001e77f0:
      if (!bVar46) {
        local_910 = pFVar29->type;
        if ((local_910 == (TypeFunction *)0x0) || ((local_910->super_TypeBase).typeID != 0x15)) {
          local_910 = (TypeFunction *)0x0;
        }
        pLVar2 = (Lexeme *)((InplaceStr *)&(local_8e8.context)->source)->end;
        if ((pLVar2 != (Lexeme *)0x0) && (*(int *)&pLVar2->pos == 0x10)) {
          local_8f8 = (ExpressionContext *)(pFVar29->name->name).begin;
          local_918 = (pFVar29->name->name).end;
          this = local_8f8;
          if (pFVar29->scope->ownerType != (TypeBase *)0x0) {
            pcVar41 = strstr((char *)local_8f8,"::");
            if (pcVar41 != (char *)0x0) {
              local_8f8 = (ExpressionContext *)(pcVar41 + 2);
              this = local_8f8;
              sVar25 = strlen((char *)local_8f8);
              local_918 = pcVar41 + sVar25 + 2;
            }
          }
          if ((ctx->functions).count != 0) {
            uVar37 = 0;
            do {
              pFVar29 = (ctx->functions).data[uVar37];
              pTVar23 = pFVar29->scope->ownerType;
              if ((pTVar23 != (TypeBase *)0x0) &&
                 ((pTVar23->isGeneric != false ||
                  ((pFVar29->type->super_TypeBase).isGeneric == true)))) {
                uVar21 = NULLC::StringHashContinue(pTVar23->nameHash,"::");
                this = (ExpressionContext *)(ulong)uVar21;
                uVar21 = NULLC::StringHashContinue(uVar21,(char *)local_8f8,local_918);
                if (pFVar29->nameHash == uVar21) {
                  pMVar40 = (pFVar29->generics).head;
                  iVar20 = 0;
                  iVar33 = 0;
                  if (pMVar40 != (MatchData *)0x0) {
                    iVar33 = 0;
                    do {
                      iVar33 = iVar33 + 1;
                      pMVar40 = pMVar40->next;
                    } while (pMVar40 != (MatchData *)0x0);
                  }
                  if (generics.head != (TypeHandle *)0x0) {
                    iVar20 = 0;
                    pTVar31 = generics.head;
                    do {
                      iVar20 = iVar20 + 1;
                      pTVar31 = pTVar31->next;
                    } while (pTVar31 != (TypeHandle *)0x0);
                  }
                  if (iVar33 == iVar20) {
                    pTVar31 = (pFVar29->type->arguments).head;
                    iVar20 = 0;
                    iVar33 = 0;
                    if (pTVar31 != (TypeHandle *)0x0) {
                      iVar33 = 0;
                      do {
                        iVar33 = iVar33 + 1;
                        pTVar31 = pTVar31->next;
                      } while (pTVar31 != (TypeHandle *)0x0);
                    }
                    pTVar31 = ((local_8e8.function)->type->arguments).head;
                    if (pTVar31 != (TypeHandle *)0x0) {
                      iVar20 = 0;
                      do {
                        iVar20 = iVar20 + 1;
                        pTVar31 = pTVar31->next;
                      } while (pTVar31 != (TypeHandle *)0x0);
                    }
                    if (iVar33 == iVar20) {
                      pTVar23 = pFVar29->scope->ownerType;
                      if ((pTVar23 == (TypeBase *)0x0) || (pTVar23->typeID != 0x16)) {
                        pTVar23 = (TypeBase *)0x0;
                      }
                      uVar47 = SUB84(pFVar29,0);
                      uVar48 = (undefined4)((ulong)pFVar29 >> 0x20);
                      if (pTVar23 == (TypeBase *)0x0) {
                        iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                        puVar27 = (undefined8 *)CONCAT44(extraout_var_04,iVar20);
                        pTVar28 = ExpressionContext::GetReferenceType(ctx,pFVar29->scope->ownerType)
                        ;
                        *(undefined4 *)(puVar27 + 1) = 9;
                        puVar27[2] = source;
                        puVar27[3] = pTVar28;
                        puVar27[4] = 0;
                        *(undefined1 *)(puVar27 + 5) = 0;
                        *puVar27 = &PTR__ExprBase_003f65c8;
                        arguments_03._12_4_ = arguments._12_4_;
                        arguments_03.count = arguments.count;
                        this = (ExpressionContext *)local_648;
                        proto_01.function._0_4_ = uVar47;
                        proto_01.source = source;
                        proto_01.function._4_4_ = uVar48;
                        proto_01.context._0_4_ = iVar20;
                        proto_01.context._4_4_ = extraout_var_04;
                        arguments_03.data = arguments.data;
                        generics_02.tail = (TypeHandle *)pAVar44;
                        generics_02.head = generics.head;
                        local_8a0 = source;
                        pFStack_898 = pFVar29;
                        local_890 = puVar27;
                        CreateGenericFunctionInstance
                                  ((FunctionValue *)this,ctx,source,proto_01,generics_02,
                                   arguments_03,true);
                      }
                      else {
                        this = (ExpressionContext *)&pTVar23[2].typeID;
                        uVar21 = 0;
                        while( true ) {
                          lVar45._0_4_ = pTVar23[2].typeID;
                          lVar45._4_4_ = pTVar23[2].nameHash;
                          uVar32 = 0;
                          if (lVar45 != 0) {
                            uVar32 = 0;
                            do {
                              uVar32 = uVar32 + 1;
                              lVar45 = *(long *)(lVar45 + 0x20);
                            } while (lVar45 != 0);
                          }
                          if (uVar32 <= uVar21) break;
                          pEVar26 = IntrusiveList<ExprBase>::operator[]
                                              ((IntrusiveList<ExprBase> *)this,uVar21);
                          if ((pEVar26 == (ExprBase *)0x0) || (pEVar26->typeID != 0x2d)) {
                            pEVar26 = (ExprBase *)0x0;
                          }
                          iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                          puVar27 = (undefined8 *)CONCAT44(extraout_var_03,iVar20);
                          pTVar28 = ExpressionContext::GetReferenceType
                                              (ctx,(TypeBase *)pEVar26[1]._vptr_ExprBase);
                          *(undefined4 *)(puVar27 + 1) = 9;
                          puVar27[2] = source;
                          puVar27[3] = pTVar28;
                          puVar27[4] = 0;
                          *(undefined1 *)(puVar27 + 5) = 0;
                          *puVar27 = &PTR__ExprBase_003f65c8;
                          if ((local_8e8.function)->scope->ownerType->isGeneric == true) {
                            arguments_01._12_4_ = arguments._12_4_;
                            arguments_01.count = arguments.count;
                            proto.function._0_4_ = uVar47;
                            proto.source = source;
                            proto.function._4_4_ = uVar48;
                            proto.context._0_4_ = iVar20;
                            proto.context._4_4_ = extraout_var_03;
                            arguments_01.data = arguments.data;
                            generics_00.tail = (TypeHandle *)pAVar44;
                            generics_00.head = generics.head;
                            local_870 = source;
                            pFStack_868 = pFVar29;
                            local_860 = puVar27;
                            CreateGenericFunctionInstance
                                      ((FunctionValue *)local_648,ctx,source,proto,generics_00,
                                       arguments_01,false);
                            local_930 = (FunctionData *)CONCAT44(local_648._12_4_,local_648._8_4_);
                            local_910 = local_930->type;
                            local_8e8.function = local_930;
                            if ((local_910 == (TypeFunction *)0x0) ||
                               ((local_910->super_TypeBase).typeID != 0x15)) {
                              local_910 = (TypeFunction *)0x0;
                            }
                          }
                          else {
                            arguments_02._12_4_ = arguments._12_4_;
                            arguments_02.count = arguments.count;
                            proto_00.function._0_4_ = uVar47;
                            proto_00.source = source;
                            proto_00.function._4_4_ = uVar48;
                            proto_00.context._0_4_ = iVar20;
                            proto_00.context._4_4_ = extraout_var_03;
                            arguments_02.data = arguments.data;
                            generics_01.tail = (TypeHandle *)pAVar44;
                            generics_01.head = generics.head;
                            local_888 = source;
                            pFStack_880 = pFVar29;
                            local_878 = puVar27;
                            CreateGenericFunctionInstance
                                      ((FunctionValue *)local_648,ctx,source,proto_00,generics_01,
                                       arguments_02,true);
                          }
                          uVar21 = uVar21 + 1;
                        }
                      }
                    }
                  }
                }
              }
              uVar37 = uVar37 + 1;
            } while (uVar37 < (ctx->functions).count);
          }
        }
        bVar46 = ExpressionContext::IsGenericFunction(this,local_930);
        local_8e8.source = (SynBase *)CONCAT44(local_8e8.source._4_4_,local_8e8.source._0_4_);
        if (bVar46) {
          arguments_04._12_4_ = arguments._12_4_;
          arguments_04.count = arguments.count;
          proto_02.source._4_4_ = local_8e8.source._4_4_;
          proto_02.source._0_4_ = local_8e8.source._0_4_;
          proto_02.function._0_4_ = (int)local_8e8.function;
          proto_02.function._4_4_ = (int)((ulong)local_8e8.function >> 0x20);
          proto_02.context._0_4_ = (int)local_8e8.context;
          proto_02.context._4_4_ = (int)((ulong)local_8e8.context >> 0x20);
          arguments_04.data = arguments.data;
          generics_03.tail = (TypeHandle *)pAVar44;
          generics_03.head = generics.head;
          CreateGenericFunctionInstance
                    ((FunctionValue *)local_648,ctx,source,proto_02,generics_03,arguments_04,false);
          local_8e8.context = (ExprBase *)local_638;
          local_8e8.function = (FunctionData *)CONCAT44(local_648._12_4_,local_648._8_4_);
          local_8e8.source = (SynBase *)local_648._0_8_;
          if (local_8e8.function != (FunctionData *)0x0) {
            local_930 = local_8e8.function;
            local_910 = (local_8e8.function)->type;
            goto LAB_001e82f1;
          }
          iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          local_908 = (TypeFunction *)CONCAT44(extraout_var_12,iVar20);
          pTVar30 = ExpressionContext::GetErrorType(ctx);
        }
        else {
LAB_001e82f1:
          pEVar26 = local_8e8.context;
          if (local_910->returnType != ctx->typeAuto) {
            bVar46 = IsVirtualFunctionCall
                               (ctx,local_930,
                                (TypeBase *)((InplaceStr *)&(local_8e8.context)->source)->end);
            if (bVar46) {
              arg1 = GetFunctionTable(ctx,source,local_8e8.function);
              name.end = "";
              name.begin = "__redirect";
              pFVar29 = (FunctionData *)
                        CreateFunctionCall2(ctx,source,name,pEVar26,arg1,false,true,true);
              iVar20 = (*ctx->allocator->_vptr_Allocator[2])();
              value = (ExprBase *)CONCAT44(extraout_var_09,iVar20);
              pTVar24 = local_930->type;
              (((ExprFunctionAccess *)value)->super_ExprBase).typeID = 0x12;
              (((ExprFunctionAccess *)value)->super_ExprBase).source = source;
              (((ExprFunctionAccess *)value)->super_ExprBase).type = &pTVar24->super_TypeBase;
              (((ExprFunctionAccess *)value)->super_ExprBase).next = (ExprBase *)0x0;
              (((ExprFunctionAccess *)value)->super_ExprBase).listed = false;
              (((ExprFunctionAccess *)value)->super_ExprBase)._vptr_ExprBase =
                   (_func_int **)&PTR__ExprBase_003f6478;
              ((ExprFunctionAccess *)value)->function = pFVar29;
              *(undefined4 *)&((ExprFunctionAccess *)value)->context = 0xd;
            }
            else {
              iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              value = (ExprBase *)CONCAT44(extraout_var_11,iVar20);
              ExprFunctionAccess::ExprFunctionAccess
                        ((ExprFunctionAccess *)value,local_8e8.source,
                         &local_930->type->super_TypeBase,local_930,pEVar26);
            }
            pSVar3 = (SynIdentifier *)ctx->allocator;
            memset((SynBase *)(local_648 + 0x10),0,0x100);
            local_648._8_4_ = 0;
            local_648._12_4_ = 0x10;
            uVar13 = (local_930->arguments).data;
            uVar14 = (local_930->arguments).count;
            functionArguments_02.count = uVar14;
            functionArguments_02.data = (ArgumentData *)uVar13;
            arguments_13.count = arguments.count;
            arguments_13.data = arguments.data;
            functionArguments_02._12_4_ = 0;
            arguments_13._12_4_ = 0;
            local_538 = pSVar3;
            local_648._0_8_ = (SynBase *)(local_648 + 0x10);
            PrepareArgumentsForFunctionCall
                      (ctx,source,functionArguments_02,arguments_13,
                       (SmallArray<CallArgumentData,_16U> *)local_648,(uint *)0x0,true);
            if (local_648._8_4_ != 0) {
              lVar45 = 8;
              uVar37 = 0;
              do {
                IntrusiveList<ExprBase>::push_back
                          (&local_8c8,
                           *(ExprBase **)
                            ((long)&((SynBase *)local_648._0_8_)->_vptr_SynBase + lVar45));
                uVar37 = uVar37 + 1;
                lVar45 = lVar45 + 0x10;
              } while (uVar37 < (uint)local_648._8_4_);
            }
            SmallArray<CallArgumentData,_16U>::~SmallArray
                      ((SmallArray<CallArgumentData,_16U> *)local_648);
            bVar46 = true;
            goto LAB_001e8575;
          }
          anon_unknown.dwarf_11255e::Report
                    (ctx,source,"ERROR: function type is unresolved at this point");
          iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          local_908 = (TypeFunction *)CONCAT44(extraout_var_10,iVar20);
          pTVar30 = ExpressionContext::GetErrorType(ctx);
        }
        (local_908->super_TypeBase).typeID = 0x29;
        uVar21 = (uint)local_8c8.head;
        uVar47 = local_8c8.head._4_4_;
        uVar32 = (uint)local_8c8.tail;
        uVar43 = local_8c8.tail._4_4_;
        goto LAB_001e8546;
      }
      bVar46 = false;
      goto LAB_001e8575;
    }
    if ((char)pTVar24 == '\0') {
      if ((((value == (ExprBase *)0x0) || (uVar21 != 1)) || (value->typeID != 8)) ||
         (((TypeStruct *)(arguments.data)->type != ctx->typeAutoRef ||
          ((arguments.data)->name != (SynIdentifier *)0x0)))) {
        pcVar41 = ctx->errorBuf;
        if ((pcVar41 != (char *)0x0) && (ctx->errorBufSize != 0)) {
          if (ctx->errorCount == 0) {
            ctx->errorPos = (source->pos).begin;
            ctx->errorBufLocation = pcVar41;
          }
          pcVar7 = ctx->errorBufLocation;
          pSVar3 = ((FunctionData *)pEVar34->code)->name;
          NULLC::SafeSprintf(pcVar7,(ulong)(ctx->errorBufSize + ((int)pcVar41 - (int)pcVar7)),
                             "ERROR: can\'t find function \'%.*s\' with following arguments:\n",
                             (ulong)(uint)(*(int *)&(pSVar3->name).end - (int)(pSVar3->name).begin))
          ;
          pcVar41 = ctx->errorBufLocation;
          sVar25 = strlen(pcVar41);
          pcVar41 = pcVar41 + sVar25;
          ctx->errorBufLocation = pcVar41;
          pSVar3 = ((FunctionData *)pEVar34->code)->name;
          local_838 = (ExprBase *)local_7f8;
          uStack_830 = (uint)pTStack_7f0;
          ratings_01._12_4_ = uStack_82c;
          ratings_01.count = (uint)pTStack_7f0;
          arguments_06._12_4_ = arguments._12_4_;
          arguments_06.count = arguments.count;
          functions_01._12_4_ = uStack_81c;
          functions_01.count = uVar32;
          functionName_00.end._4_4_ = (int)((ulong)(pSVar3->name).end >> 0x20);
          functionName_00._0_12_ = *(undefined1 (*) [12])&pSVar3->name;
          functions_01.data = (FunctionValue *)pEVar34;
          arguments_06.data = arguments.data;
          ratings_01.data = (uint *)local_7f8;
          local_828 = pEVar34;
          uStack_820 = uVar32;
          ReportOnFunctionSelectError
                    (ctx,source,pcVar41,(*(int *)&ctx->errorBuf - (int)pcVar41) + ctx->errorBufSize,
                     pcVar7,functionName_00,functions_01,generics,arguments_06,ratings_01,0xffffffff
                     ,true);
          pcVar41 = ctx->errorBufLocation;
          sVar25 = strlen(pcVar41);
          ctx->errorBufLocation = pcVar41 + sVar25;
        }
        pAVar44 = arguments.data;
        if (ctx->errorHandlerNested == true) {
          if (ctx->errorHandlerActive == false) {
            __assert_fail("ctx.errorHandlerActive",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1d49,
                          "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
LAB_001e8b8a:
          longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
        }
        ctx->errorCount = ctx->errorCount + 1;
        local_648._0_4_ = 0;
        local_648._4_4_ = 0;
        local_648._8_4_ = 0;
        local_648._12_4_ = 0;
        if (uVar37 != 0) {
          lVar45 = 0;
          do {
            iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar26 = *(ExprBase **)((long)&pAVar44->value + lVar45);
            ExprPassthrough::ExprPassthrough
                      ((ExprPassthrough *)CONCAT44(extraout_var_05,iVar20),pEVar26->source,
                       pEVar26->type,pEVar26);
            IntrusiveList<ExprBase>::push_back
                      ((IntrusiveList<ExprBase> *)local_648,
                       (ExprBase *)CONCAT44(extraout_var_05,iVar20));
            lVar45 = lVar45 + 0x30;
          } while (uVar37 * 0x30 != lVar45);
        }
        iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
        local_908 = (TypeFunction *)CONCAT44(extraout_var_06,iVar20);
        pTVar30 = ExpressionContext::GetErrorType(ctx);
        (local_908->super_TypeBase).typeID = 0x29;
        uVar21 = local_648._0_4_;
        uVar47 = local_648._4_4_;
        uVar32 = local_648._8_4_;
        uVar43 = local_648._12_4_;
LAB_001e8546:
        (local_908->super_TypeBase).name.begin = (char *)source;
        (local_908->super_TypeBase).name.end = (char *)pTVar30;
        (local_908->super_TypeBase).importModule = (ModuleData *)0x0;
        *(undefined1 *)&(local_908->super_TypeBase).typeIndex = 0;
        (local_908->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__ExprBase_003f6a98;
        (local_908->super_TypeBase).size = (longlong)value;
        (local_908->super_TypeBase).padding = uVar21;
        (local_908->super_TypeBase).isGeneric = (bool)(char)uVar47;
        (local_908->super_TypeBase).hasPointers = (bool)SUB41(uVar47,1);
        (local_908->super_TypeBase).hasTranslation = (bool)SUB41(uVar47,2);
        (local_908->super_TypeBase).field_0x3f = SUB41(uVar47,3);
        *(uint *)&(local_908->super_TypeBase).refType = uVar32;
        *(uint *)((long)&(local_908->super_TypeBase).refType + 4) = uVar43;
      }
      else {
        local_908 = (TypeFunction *)
                    CreateCast(ctx,source,(arguments.data)->value,
                               (TypeBase *)value[1]._vptr_ExprBase,true);
        pEVar26 = (ExprBase *)pEVar34->codeEnd;
        if ((pEVar26 == (ExprBase *)0x0) || (pEVar26->typeID != 9)) {
          local_908 = (TypeFunction *)CreateAssignment(ctx,source,pEVar26,(ExprBase *)local_908);
        }
      }
      bVar46 = false;
    }
    else {
      bVar46 = false;
      local_908 = (TypeFunction *)0x0;
    }
LAB_001e8575:
    SmallArray<unsigned_int,_32U>::~SmallArray((SmallArray<unsigned_int,_32U> *)local_7f8);
    pTVar24 = local_908;
joined_r0x001e8584:
    if (!bVar46) {
      return (ExprBase *)pTVar24;
    }
LAB_001e858a:
    if (local_910 == (TypeFunction *)0x0) {
      __assert_fail("type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e8b,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    if ((local_910->super_TypeBase).isGeneric == true) {
      pcVar41 = "ERROR: generic function call is not supported";
LAB_001e8aa9:
      anon_unknown.dwarf_11255e::Stop(ctx,source,pcVar41);
    }
    iVar20 = 0;
    iVar33 = 0;
    if (local_8c8.head != (ExprBase *)0x0) {
      iVar33 = 0;
      pEVar26 = local_8c8.head;
      do {
        iVar33 = iVar33 + 1;
        pEVar26 = pEVar26->next;
      } while (pEVar26 != (ExprBase *)0x0);
    }
    pTVar31 = (local_910->arguments).head;
    if (pTVar31 != (TypeHandle *)0x0) {
      iVar20 = 0;
      do {
        iVar20 = iVar20 + 1;
        pTVar31 = pTVar31->next;
      } while (pTVar31 != (TypeHandle *)0x0);
    }
    if (iVar33 != iVar20) {
      __assert_fail("actualArguments.size() == type->arguments.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e90,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    pEVar26 = local_8c8.head;
    for (pTVar31 = (local_910->arguments).head;
        (pEVar26 != (ExprBase *)0x0 && (pTVar31 != (TypeHandle *)0x0)); pTVar31 = pTVar31->next) {
      if (pEVar26->type != pTVar31->type) {
        __assert_fail("actual->type == expected->type",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1e97,
                      "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      pEVar26 = pEVar26->next;
    }
    if (pEVar26 != (ExprBase *)0x0) {
      __assert_fail("actual == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e99,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    if (pTVar31 != (TypeHandle *)0x0) {
      __assert_fail("expected == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e9a,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    iVar20 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar26 = (ExprBase *)CONCAT44(extraout_var_13,iVar20);
    pTVar23 = local_910->returnType;
  }
  pEVar26->typeID = 0x29;
  pEVar26->source = source;
  pEVar26->type = pTVar23;
  pEVar26->next = (ExprBase *)0x0;
  pEVar26->listed = false;
  pEVar26->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6a98;
  pEVar26[1]._vptr_ExprBase = (_func_int **)value;
  local_648._0_4_ = (uint)local_8c8.head;
  local_648._4_4_ = local_8c8.head._4_4_;
  local_648._8_4_ = (uint)local_8c8.tail;
  local_648._12_4_ = local_8c8.tail._4_4_;
LAB_001e8670:
  pEVar26[1].typeID = local_648._0_4_;
  *(undefined4 *)&pEVar26[1].field_0xc = local_648._4_4_;
  *(undefined4 *)&pEVar26[1].source = local_648._8_4_;
  *(undefined4 *)((long)&pEVar26[1].source + 4) = local_648._12_4_;
  return pEVar26;
LAB_001e7392:
  uVar42 = uVar42 + 1;
  bVar46 = uVar42 < uVar36;
  ppFVar39 = ppFVar39 + 3;
  if (uVar36 == uVar42) goto LAB_001e77f0;
  goto LAB_001e711d;
}

Assistant:

ExprBase* CreateFunctionCallFinal(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, bool allowFailure)
{
	bool isErrorCall = false;

	if(value)
	{
		if(isType<TypeError>(value->type))
			isErrorCall = true;
	}

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		if(isType<TypeError>(arguments[i].value->type) || !AssertResolvableTypeLiteral(ctx, source, arguments[i].value))
			isErrorCall = true;
	}

	for(TypeHandle *curr = generics.head; curr; curr = curr->next)
	{
		if(isType<TypeError>(curr->type) || !AssertResolvableType(ctx, source, curr->type, false))
			isErrorCall = true;
	}

	if(isErrorCall)
	{
		IntrusiveList<ExprBase> errorArguments;

		for(unsigned i = 0; i < arguments.size(); i++)
			errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
	}

	TypeFunction *type = value ? getType<TypeFunction>(value->type) : NULL;

	IntrusiveList<ExprBase> actualArguments;

	if(!functions.empty())
	{
		SmallArray<unsigned, 32> ratings(ctx.allocator);

		FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, generics, arguments, ratings);

		// Didn't find an appropriate function
		if(!bestOverload)
		{
			if(allowFailure)
				return NULL;

			// auto ref -> type cast
			if(isType<ExprTypeLiteral>(value) && arguments.size() == 1 && arguments[0].type == ctx.typeAutoRef && !arguments[0].name)
			{
				ExprBase *result = CreateCast(ctx, source, arguments[0].value, ((ExprTypeLiteral*)value)->value, true);

				// If this was a member function call, store to context
				if(!isType<ExprNullptrLiteral>(functions[0].context))
					return CreateAssignment(ctx, source, functions[0].context, result);

				return result;
			}

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: can't find function '%.*s' with following arguments:\n", FMT_ISTR(functions[0].function->name->name));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions[0].function->name->name, functions, generics, arguments, ratings, ~0u, true);

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			if(ctx.errorHandlerNested)
			{
				assert(ctx.errorHandlerActive);

				longjmp(ctx.errorHandler, 1);
			}

			ctx.errorCount++;

			IntrusiveList<ExprBase> errorArguments;

			for(unsigned i = 0; i < arguments.size(); i++)
				errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
		}

		unsigned bestRating = ~0u;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			if(functions[i].function == bestOverload.function)
				bestRating = ratings[i];
		}

		// Check if multiple functions share the same rating
		for(unsigned i = 0; i < functions.size(); i++)
		{
			if(functions[i].function != bestOverload.function && ratings[i] == bestRating)
			{
				// For a function call through 'auto ref' it is ok to have the same function signature in different types
				if(isType<TypeAutoRef>(bestOverload.context->type) && ctx.IsGenericFunction(functions[i].function) && ctx.IsGenericFunction(bestOverload.function))
				{
					TypeFunction *instanceA = NULL;
					IntrusiveList<MatchData> aliasesA;
					SmallArray<CallArgumentData, 16> resultA(ctx.allocator);

					// Handle named argument order, default argument values and variadic functions
					if(PrepareArgumentsForFunctionCall(ctx, source, functions[i].function->arguments, arguments, resultA, NULL, false))
						instanceA = GetGenericFunctionInstanceType(ctx, source, functions[i].function->scope->ownerType, functions[i].function, resultA, aliasesA);

					TypeFunction *instanceB = NULL;
					IntrusiveList<MatchData> aliasesB;
					SmallArray<CallArgumentData, 16> resultB(ctx.allocator);

					if(PrepareArgumentsForFunctionCall(ctx, source, bestOverload.function->arguments, arguments, resultB, NULL, false))
						instanceB = GetGenericFunctionInstanceType(ctx, source, bestOverload.function->scope->ownerType, bestOverload.function, resultB, aliasesB);

					if(instanceA && instanceB && instanceA == instanceB)
						continue;
				}

				if(ctx.errorBuf && ctx.errorBufSize)
				{
					if(ctx.errorCount == 0)
					{
						ctx.errorPos = source->pos.begin;
						ctx.errorBufLocation = ctx.errorBuf;
					}

					const char *messageStart = ctx.errorBufLocation;

					NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: ambiguity, there is more than one overloaded function available for the call:\n");

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);

					ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions[0].function->name->name, functions, generics, arguments, ratings, bestRating, true);

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);
				}

				if(ctx.errorHandlerNested)
				{
					assert(ctx.errorHandlerActive);

					longjmp(ctx.errorHandler, 1);
				}

				ctx.errorCount++;

				IntrusiveList<ExprBase> errorArguments;

				for(unsigned i = 0; i < arguments.size(); i++)
					errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
			}
		}

		FunctionData *function = bestOverload.function;

		type = getType<TypeFunction>(function->type);

		if(isType<TypeAutoRef>(bestOverload.context->type))
		{
			InplaceStr baseName = bestOverload.function->name->name;

			if(bestOverload.function->scope->ownerType)
			{
				if(const char *pos = strstr(baseName.begin, "::"))
					baseName = InplaceStr(pos + 2);
			}

			// For function call through 'auto ref', we have to instantiate all matching member functions of generic types
			for(unsigned i = 0; i < ctx.functions.size(); i++)
			{
				FunctionData *el = ctx.functions[i];

				if(!el->scope->ownerType)
					continue;

				if(!el->scope->ownerType->isGeneric && !el->type->isGeneric)
					continue;

				unsigned hash = NULLC::StringHashContinue(el->scope->ownerType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, baseName.begin, baseName.end);

				if(el->nameHash != hash)
					continue;

				if(el->generics.size() != generics.size())
					continue;

				if(el->type->arguments.size() != bestOverload.function->type->arguments.size())
					continue;

				if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(el->scope->ownerType))
				{
					for(unsigned k = 0; k < proto->instances.size(); k++)
					{
						ExprClassDefinition *definition = getType<ExprClassDefinition>(proto->instances[k]);

						ExprBase *emptyContext = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.GetReferenceType(definition->classType));

						if(bestOverload.function->scope->ownerType->isGeneric)
						{
							FunctionValue instance = CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, false);

							bestOverload.function = instance.function;

							function = instance.function;

							type = getType<TypeFunction>(function->type);
						}
						else
						{
							CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, true);
						}
					}
				}
				else
				{
					ExprBase *emptyContext = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.GetReferenceType(el->scope->ownerType));

					CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, true);
				}
			}
		}

		if(ctx.IsGenericFunction(function))
		{
			bestOverload = CreateGenericFunctionInstance(ctx, source, bestOverload, generics, arguments, false);

			if(!bestOverload)
				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);

			function = bestOverload.function;

			type = getType<TypeFunction>(function->type);
		}

		if(type->returnType == ctx.typeAuto)
		{
			Report(ctx, source, "ERROR: function type is unresolved at this point");

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}

		if(IsVirtualFunctionCall(ctx, function, bestOverload.context->type))
		{
			ExprBase *table = GetFunctionTable(ctx, source, bestOverload.function);

			value = CreateFunctionCall2(ctx, source, InplaceStr("__redirect"), bestOverload.context, table, false, true, true);

			value = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, function->type, value, EXPR_CAST_REINTERPRET);
		}
		else
		{
			value = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, function->type, function, bestOverload.context);
		}

		SmallArray<CallArgumentData, 16> result(ctx.allocator);

		PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, true);

		for(unsigned i = 0; i < result.size(); i++)
			actualArguments.push_back(result[i].value);
	}
	else if(type)
	{
		if(type->returnType == ctx.typeAuto)
		{
			Report(ctx, source, "ERROR: function type is unresolved at this point");

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}

		SmallArray<ArgumentData, 8> functionArguments(ctx.allocator);

		for(TypeHandle *argType = type->arguments.head; argType; argType = argType->next)
			functionArguments.push_back(ArgumentData(NULL, false, NULL, argType->type, NULL));

		SmallArray<CallArgumentData, 16> result(ctx.allocator);

		if(!PrepareArgumentsForFunctionCall(ctx, source, functionArguments, arguments, result, NULL, true))
		{
			if(allowFailure)
				return NULL;

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				char *errorBuf = ctx.errorBufLocation;
				unsigned errorBufSize = ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf);

				char *errPos = ctx.errorBufLocation;

				if(arguments.size() != functionArguments.size())
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "ERROR: function expects %d argument(s), while %d are supplied\n", functionArguments.size(), arguments.size());
				else
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "ERROR: there is no conversion from specified arguments and the ones that function accepts\n");

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\tExpected: (");

				for(unsigned i = 0; i < functionArguments.size(); i++)
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(functionArguments[i].type->name));

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")\n");
			
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\tProvided: (");

				for(unsigned i = 0; i < arguments.size(); i++)
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				AddErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
			}

			if(ctx.errorHandlerNested)
			{
				assert(ctx.errorHandlerActive);

				longjmp(ctx.errorHandler, 1);
			}

			ctx.errorCount++;

			IntrusiveList<ExprBase> errorArguments;

			for(unsigned i = 0; i < arguments.size(); i++)
				errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
		}

		for(unsigned i = 0; i < result.size(); i++)
			actualArguments.push_back(result[i].value);
	}
	else if(isType<ExprTypeLiteral>(value) && arguments.size() == 1 && !arguments[0].name)
	{
		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value))
		{
			if(isType<TypeGenericClassProto>(typeLiteral->value))
				Stop(ctx, source, "ERROR: generic type arguments in <> are not found after constructor name");
			else if(typeLiteral->value->isGeneric)
				Stop(ctx, source, "ERROR: can't cast to a generic type");
		}

		// Function-style type casts
		return CreateCast(ctx, source, arguments[0].value, ((ExprTypeLiteral*)value)->value, true);
	}
	else
	{
		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value))
		{
			if(isType<TypeGenericClassProto>(typeLiteral->value))
				Stop(ctx, source, "ERROR: generic type arguments in <> are not found after constructor name");
			else if(typeLiteral->value->isGeneric)
				Stop(ctx, source, "ERROR: can't cast to a generic type");
		}

		// Call operator()
		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("()"), false))
		{
			SmallArray<ArgumentData, 32> callArguments(ctx.allocator);
			callArguments.push_back(ArgumentData(value->source, false, NULL, value->type, value));

			for(unsigned i = 0; i < arguments.size(); i++)
				callArguments.push_back(arguments[i]);

			if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, callArguments, false))
				return result;
		}
		else
		{
			Report(ctx, source, "ERROR: operator '()' accepting %d argument(s) is undefined for a class '%.*s'", arguments.size(), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}
	}

	assert(type);

	if(type->isGeneric)
		Stop(ctx, source, "ERROR: generic function call is not supported");

	assert(actualArguments.size() == type->arguments.size());

	{
		ExprBase *actual = actualArguments.head;
		TypeHandle *expected = type->arguments.head;

		for(; actual && expected; actual = actual->next, expected = expected->next)
			assert(actual->type == expected->type);

		assert(actual == NULL);
		assert(expected == NULL);
	}

	return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, type->returnType, value, actualArguments);
}